

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cpp
# Opt level: O1

string * pbrt::detail::copyToFormatString(string *__return_storage_ptr__,char **fmt_ptr,string *s)

{
  char cVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  
  do {
    cVar1 = **fmt_ptr;
    if (cVar1 == '%') {
      if ((*fmt_ptr)[1] != '%') {
LAB_002dc851:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        do {
          bVar2 = **fmt_ptr;
          if (bVar2 == 0) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::push_back((char)__return_storage_ptr__);
          *fmt_ptr = *fmt_ptr + 1;
          uVar4 = bVar2 - 0x41;
        } while ((0x37 < uVar4) || ((0x94c17d00040075U >> ((ulong)uVar4 & 0x3f) & 1) == 0));
        return __return_storage_ptr__;
      }
      std::__cxx11::string::push_back((char)s);
      lVar3 = 2;
    }
    else {
      if (cVar1 == '\0') goto LAB_002dc851;
      lVar3 = 1;
    }
    std::__cxx11::string::push_back((char)s);
    *fmt_ptr = *fmt_ptr + lVar3;
  } while( true );
}

Assistant:

std::string copyToFormatString(const char **fmt_ptr, std::string *s) {
    const char *&fmt = *fmt_ptr;
    while (*fmt) {
        if (*fmt != '%') {
            *s += *fmt;
            ++fmt;
        } else if (fmt[1] == '%') {
            // "%%"; let it pass through
            *s += '%';
            *s += '%';
            fmt += 2;
        } else
            // fmt is at the start of a formatting directive.
            break;
    }

    std::string nextFmt;
    while (*fmt) {
        char c = *fmt;
        nextFmt += c;
        ++fmt;
        // Is it a conversion specifier?
        if (c == 'd' || c == 'i' || c == 'o' || c == 'u' || c == 'x' || c == 'e' ||
            c == 'E' || c == 'f' || c == 'F' || c == 'g' || c == 'G' || c == 'a' ||
            c == 'A' || c == 'c' || c == 'C' || c == 's' || c == 'S' || c == 'p')
            break;
    }

    return nextFmt;
}